

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop.c
# Opt level: O1

int run_test_tcp_read_stop(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_b_3;
  sockaddr_in addr;
  uv_connect_t connect_req;
  undefined1 auStack_c0 [8];
  undefined8 uStack_b8;
  undefined8 uStack_a8;
  code *pcStack_a0;
  long local_90;
  long local_88;
  undefined1 local_80 [16];
  long local_70 [13];
  
  pcStack_a0 = (code *)0x1cdbc2;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_80);
  local_70[0] = (long)iVar1;
  local_90 = 0;
  if (local_70[0] == 0) {
    pcStack_a0 = (code *)0x1cdbe7;
    uVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1cdbf6;
    iVar1 = uv_timer_init(uVar2,&timer_handle);
    local_70[0] = (long)iVar1;
    local_90 = 0;
    if (local_70[0] != 0) goto LAB_001cdd21;
    pcStack_a0 = (code *)0x1cdc1b;
    uVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1cdc2a;
    iVar1 = uv_tcp_init(uVar2,&tcp_handle);
    local_70[0] = (long)iVar1;
    local_90 = 0;
    if (local_70[0] != 0) goto LAB_001cdd30;
    pcStack_a0 = (code *)0x1cdc67;
    iVar1 = uv_tcp_connect(local_70,&tcp_handle,local_80,connect_cb);
    local_90 = (long)iVar1;
    local_88 = 0;
    if (local_90 != 0) goto LAB_001cdd3f;
    pcStack_a0 = (code *)0x1cdc8c;
    uVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1cdc96;
    iVar1 = uv_run(uVar2,0);
    local_90 = (long)iVar1;
    local_88 = 0;
    if (local_90 != 0) goto LAB_001cdd4e;
    pcStack_a0 = (code *)0x1cdcbb;
    uVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1cdccf;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_a0 = (code *)0x1cdcd9;
    uv_run(uVar2,0);
    local_90 = 0;
    pcStack_a0 = (code *)0x1cdce7;
    uVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1cdcef;
    iVar1 = uv_loop_close(uVar2);
    local_88 = (long)iVar1;
    if (local_90 == local_88) {
      pcStack_a0 = (code *)0x1cdd07;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_a0 = (code *)0x1cdd21;
    run_test_tcp_read_stop_cold_1();
LAB_001cdd21:
    pcStack_a0 = (code *)0x1cdd30;
    run_test_tcp_read_stop_cold_2();
LAB_001cdd30:
    pcStack_a0 = (code *)0x1cdd3f;
    run_test_tcp_read_stop_cold_3();
LAB_001cdd3f:
    pcStack_a0 = (code *)0x1cdd4e;
    run_test_tcp_read_stop_cold_4();
LAB_001cdd4e:
    pcStack_a0 = (code *)0x1cdd5d;
    run_test_tcp_read_stop_cold_5();
  }
  iVar1 = (int)&local_88;
  pcStack_a0 = connect_cb;
  run_test_tcp_read_stop_cold_6();
  pcStack_a0 = (code *)(long)iVar1;
  uStack_a8 = 0;
  if (pcStack_a0 == (code *)0x0) {
    uStack_b8 = (code *)0x1cdda7;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    pcStack_a0 = (code *)(long)iVar1;
    uStack_a8 = 0;
    if (pcStack_a0 == (code *)0x0) {
      uStack_b8 = (code *)0x1cddd9;
      iVar1 = uv_read_start(&tcp_handle,fail_cb);
      pcStack_a0 = (code *)(long)iVar1;
      uStack_a8 = 0;
      if (pcStack_a0 == (code *)0x0) {
        return iVar1;
      }
      goto LAB_001cde18;
    }
  }
  else {
    uStack_b8 = (code *)0x1cde09;
    connect_cb_cold_1();
  }
  uStack_b8 = (code *)0x1cde18;
  connect_cb_cold_2();
LAB_001cde18:
  uStack_b8 = timer_cb;
  connect_cb_cold_3();
  _auStack_c0 = uv_buf_init("PING",4);
  iVar1 = uv_write(&write_req,&tcp_handle,auStack_c0,1,write_cb);
  if (iVar1 == 0) {
    iVar1 = uv_read_stop(&tcp_handle);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    timer_cb_cold_1();
  }
  timer_cb_cold_2();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop.c"
          ,0x1f,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(tcp_read_stop) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_tcp_init(uv_default_loop(), &tcp_handle));
  ASSERT_OK(uv_tcp_connect(&connect_req,
                           &tcp_handle,
                           (const struct sockaddr*) &addr,
                           connect_cb));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());

  return 0;
}